

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3phseg_io.c
# Opt level: O1

int s3lattice_read(char *fn,s3lattice_t **lattice)

{
  int iVar1;
  FILE *__stream;
  s3lattice_t *psVar2;
  char *pcVar3;
  s3arc_s *psVar4;
  uint32 *puVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint32 id;
  char temp [16];
  char line [1024];
  undefined1 local_45c [4];
  s3lattice_t **local_458;
  ulong local_450;
  undefined1 local_448 [16];
  char local_438 [1032];
  
  __stream = fopen(fn,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
            ,0xb7,"Failed to open lattice file %s\n",fn);
  }
  else {
    psVar2 = (s3lattice_t *)
             __ckd_calloc__(1,0x20,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                            ,0xbb);
    fgets(local_438,0x400,__stream);
    pcVar3 = strstr(local_438,"Total arcs");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "Lattice Format Error, missing Total arcs\n";
      lVar6 = 0xc1;
    }
    else {
      fgets(local_438,0x400,__stream);
      iVar1 = __isoc99_sscanf(local_438,"%d",psVar2);
      if (iVar1 == 1) {
        if (psVar2->n_arcs == 0) {
          pcVar3 = "No arc exits in the lattice\n";
          lVar6 = 0xcb;
        }
        else {
          fgets(local_438,0x400,__stream);
          pcVar3 = strstr(local_438,"True arcs");
          if (pcVar3 == (char *)0x0) {
            pcVar3 = "Lattice Format Error, missing True arcs\n";
            lVar6 = 0xd2;
          }
          else {
            local_458 = lattice;
            fgets(local_438,0x400,__stream);
            iVar1 = __isoc99_sscanf(local_438,"%d",&psVar2->n_true_arcs);
            if (iVar1 == 1) {
              uVar7 = psVar2->n_true_arcs;
              if (uVar7 == 0) {
                pcVar3 = "No arc from the numerator lattice\n";
                lVar6 = 0xdc;
              }
              else if (psVar2->n_arcs < uVar7) {
                pcVar3 = 
                "The number of arcs from numerator lattice is larger than the number of total arcs\n"
                ;
                lVar6 = 0xe0;
              }
              else {
                fgets(local_438,0x400,__stream);
                pcVar3 = strstr(local_438,"arc_id");
                if (pcVar3 != (char *)0x0) {
                  psVar4 = (s3arc_s *)
                           __ckd_calloc__((ulong)psVar2->n_arcs,0xd8,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                                          ,0xec);
                  psVar2->arc = psVar4;
                  iVar1 = __isoc99_fscanf(__stream,"%d",local_45c);
                  if (iVar1 != -1) {
                    uVar7 = 0;
                    do {
                      uVar8 = (ulong)uVar7;
                      __isoc99_fscanf(__stream,"%s",psVar2->arc + uVar8);
                      __isoc99_fscanf(__stream,"%d",&psVar2->arc[uVar8].sf);
                      __isoc99_fscanf(__stream,"%d",&psVar2->arc[uVar8].ef);
                      __isoc99_fscanf(__stream,"%lf",&psVar2->arc[uVar8].lm_score);
                      __isoc99_fscanf(__stream,"%d",&psVar2->arc[uVar8].n_prev_arcs);
                      __isoc99_fscanf(__stream,"%d",&psVar2->arc[uVar8].n_next_arcs);
                      __isoc99_fscanf(__stream,"%s",local_448);
                      uVar9 = (ulong)psVar2->arc[uVar8].n_prev_arcs;
                      if (uVar9 == 0) {
                        pcVar3 = "No preceding arc exits\n";
                        lVar6 = 0xfb;
                        goto LAB_0011fe3c;
                      }
                      local_450 = uVar8;
                      puVar5 = (uint32 *)
                               __ckd_calloc__(uVar9,4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                                              ,0xfe);
                      psVar4 = psVar2->arc;
                      psVar4[uVar8].prev_arcs = puVar5;
                      if (psVar4[uVar8].n_prev_arcs != 0) {
                        lVar6 = 0;
                        uVar9 = 0;
                        do {
                          __isoc99_fscanf(__stream,"%d",(long)psVar4[uVar8].prev_arcs + lVar6);
                          uVar9 = uVar9 + 1;
                          psVar4 = psVar2->arc;
                          lVar6 = lVar6 + 4;
                        } while (uVar9 < psVar4[uVar8].n_prev_arcs);
                      }
                      __isoc99_fscanf(__stream,"%s",local_448);
                      uVar9 = (ulong)psVar2->arc[uVar8].n_next_arcs;
                      if (uVar9 == 0) {
                        pcVar3 = "No succeeding arc exits\n";
                        lVar6 = 0x105;
                        goto LAB_0011fe3c;
                      }
                      puVar5 = (uint32 *)
                               __ckd_calloc__(uVar9,4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                                              ,0x108);
                      psVar4 = psVar2->arc;
                      psVar4[uVar8].next_arcs = puVar5;
                      if (psVar4[uVar8].n_next_arcs != 0) {
                        lVar6 = 0;
                        uVar9 = 0;
                        do {
                          __isoc99_fscanf(__stream,"%d",(long)psVar4[uVar8].next_arcs + lVar6);
                          uVar9 = uVar9 + 1;
                          psVar4 = psVar2->arc;
                          lVar6 = lVar6 + 4;
                        } while (uVar9 < psVar4[uVar8].n_next_arcs);
                      }
                      uVar7 = (int)local_450 + 1;
                      iVar1 = __isoc99_fscanf(__stream,"%d",local_45c);
                    } while (iVar1 != -1);
                  }
                  fclose(__stream);
                  *local_458 = psVar2;
                  return 0;
                }
                pcVar3 = "Lattice Format Error\n";
                lVar6 = 0xe7;
              }
            }
            else {
              pcVar3 = "Lattice Format Error, missing True arcs\n";
              lVar6 = 0xd8;
            }
          }
        }
      }
      else {
        pcVar3 = "Lattice Format Error, missing Total arcs\n";
        lVar6 = 199;
      }
    }
LAB_0011fe3c:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
            ,lVar6,pcVar3);
    fclose(__stream);
  }
  return -1;
}

Assistant:

int
s3lattice_read(const char *fn,
	       s3lattice_t **lattice)
{
  FILE *fp;
  uint32 id;
  char line[1024], temp[16];
  s3lattice_t *out_lattice;
  uint32 i, j, n;
  
  if ((fp = fopen(fn, "r")) == NULL) {
    E_ERROR("Failed to open lattice file %s\n", fn);
    return S3_ERROR;
  }
  
  out_lattice = ckd_calloc(1, sizeof(*out_lattice));
  
  /* process file head */
  /* read the number of total arcs */
  fgets(line, sizeof(line), fp);
  if (strstr(line, "Total arcs") == NULL) {
    E_ERROR("Lattice Format Error, missing Total arcs\n");
    goto error_out;
  }
  fgets(line, sizeof(line), fp);
  n = sscanf(line, "%d", &out_lattice->n_arcs);
  if (n!=1) {
    E_ERROR("Lattice Format Error, missing Total arcs\n");
    goto error_out;
  }
  if (out_lattice->n_arcs == 0) {
    E_ERROR("No arc exits in the lattice\n");
    goto error_out;
  }

  /* read the number of true arcs */
  fgets(line, sizeof(line), fp);
  if (strstr(line, "True arcs") == NULL) {
    E_ERROR("Lattice Format Error, missing True arcs\n");
    goto error_out;
  }
  fgets(line, sizeof(line), fp);
  n = sscanf(line, "%d", &out_lattice->n_true_arcs);
  if (n!=1) {
    E_ERROR("Lattice Format Error, missing True arcs\n");
    goto error_out;
  }
  if (out_lattice->n_true_arcs == 0) {
    E_ERROR("No arc from the numerator lattice\n");
    goto error_out;
  }
  if (out_lattice->n_true_arcs > out_lattice->n_arcs) {
    E_ERROR("The number of arcs from numerator lattice is larger than the number of total arcs\n");
    goto error_out;
  }

  /* read parameter lists */
  fgets(line, sizeof(line), fp);
  if (strstr(line, "arc_id") == NULL) {
    E_ERROR("Lattice Format Error\n");
    goto error_out;
  }
  
  /* allocate memory for arcs */
  out_lattice->arc = ckd_calloc(out_lattice->n_arcs, sizeof(*out_lattice->arc));
  
  i = 0;
  /* Get each arc */
  while (fscanf(fp, "%d", &id) != EOF) {/* arc id */
    fscanf(fp, "%s", out_lattice->arc[i].word);/* word */
    fscanf(fp, "%d", &out_lattice->arc[i].sf);/* start frame */
    fscanf(fp, "%d", &out_lattice->arc[i].ef);/* end frame */
    fscanf(fp, "%lf", &out_lattice->arc[i].lm_score);/* LM score */
    fscanf(fp, "%d", &out_lattice->arc[i].n_prev_arcs);/* num of previous arcs */
    fscanf(fp, "%d", &out_lattice->arc[i].n_next_arcs);/* num of succeeding arcs */
    
    /* read preceding arc ids */
    fscanf(fp, "%s", temp);/* move over '<' */
    if (out_lattice->arc[i].n_prev_arcs == 0) {
      E_ERROR("No preceding arc exits\n");
      goto error_out;
    }
    out_lattice->arc[i].prev_arcs = ckd_calloc(out_lattice->arc[i].n_prev_arcs, sizeof(int));
    for (j=0; j<out_lattice->arc[i].n_prev_arcs; j++)
      fscanf(fp, "%d", &out_lattice->arc[i].prev_arcs[j]);
    
    /* read succeeding arc ids */
    fscanf(fp, "%s", temp);/* move over '<' */
    if (out_lattice->arc[i].n_next_arcs == 0) {
      E_ERROR("No succeeding arc exits\n");
      goto error_out;
    }
    out_lattice->arc[i].next_arcs = ckd_calloc(out_lattice->arc[i].n_next_arcs, sizeof(int));
    for (j=0; j<out_lattice->arc[i].n_next_arcs; j++)
      fscanf(fp, "%d", &out_lattice->arc[i].next_arcs[j]);
    
    i++;
  }
  fclose(fp);
  
  *lattice = out_lattice;
  
  return S3_SUCCESS;
 error_out:
  fclose(fp);
  return S3_ERROR;
}